

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::Nested>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::Nested> *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    **pointer = 1;
    Own<kj::(anonymous_namespace)::Nested,_std::nullptr_t>::dispose
              ((Own<kj::(anonymous_namespace)::Nested,_std::nullptr_t> *)((long)pointer + 8));
  }
  operator_delete(pointer,0x18);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }